

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChLineNurbs::Derive(ChLineNurbs *this,ChVector<double> *dir,double parU)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  double *pdVar7;
  ulong uVar8;
  ChVectorDynamic<> mdR;
  ChVectorDynamic<> mR;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  double local_30;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_28;
  
  local_30 = ComputeKnotUfromU(this,parU);
  local_28.m_storage.m_data = (double *)0x0;
  local_28.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_28,(long)this->p + 1);
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_48,(long)this->p + 1);
  ChBasisToolsNurbs::BasisEvaluateDeriv
            (this->p,local_30,&this->weights,&this->knots,(ChVectorDynamic<> *)&local_28,
             (ChVectorDynamic<> *)&local_48);
  iVar6 = ChBasisToolsBspline::FindSpan(this->p,local_30,&this->knots);
  if (dir != (ChVector<double> *)&VNULL) {
    dir->m_data[0] = VNULL;
    dir->m_data[1] = DAT_00b90ac0;
    dir->m_data[2] = DAT_00b90ac8;
  }
  uVar5 = this->p;
  if (-1 < (int)uVar5) {
    dVar1 = dir->m_data[0];
    dVar2 = dir->m_data[1];
    dVar3 = dir->m_data[2];
    pdVar7 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)(iVar6 - uVar5)].m_data + 2;
    uVar8 = 0;
    do {
      if ((~(local_48.m_storage.m_rows >> 0x3f) & local_48.m_storage.m_rows) == uVar8) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      dVar4 = local_48.m_storage.m_data[uVar8];
      dVar1 = dVar4 * ((ChVector<double> *)(pdVar7 + -2))->m_data[0] + dVar1;
      dVar2 = dVar4 * pdVar7[-1] + dVar2;
      dVar3 = dVar4 * *pdVar7 + dVar3;
      dir->m_data[0] = dVar1;
      dir->m_data[1] = dVar2;
      dir->m_data[2] = dVar3;
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + 3;
    } while ((ulong)uVar5 + 1 != uVar8);
  }
  if (local_48.m_storage.m_data != (double *)0x0) {
    free((void *)local_48.m_storage.m_data[-1]);
  }
  if (local_28.m_storage.m_data != (double *)0x0) {
    free((void *)local_28.m_storage.m_data[-1]);
  }
  return;
}

Assistant:

void ChLineNurbs::Derive(ChVector<>& dir, const double parU) const {
    double u = ComputeKnotUfromU(parU);

    ChVectorDynamic<> mR(this->p + 1);
    ChVectorDynamic<> mdR(this->p + 1);
    ChBasisToolsNurbs::BasisEvaluateDeriv(this->p, u, this->weights, this->knots, mR, mdR);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    dir = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        dir += points[uind + i] * mdR(i);
    }
}